

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O1

bool __thiscall glu::Layout::operator==(Layout *this,Layout *other)

{
  MatrixOrder MVar1;
  MatrixOrder MVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  
  auVar3[0] = -((char)other->location == (char)this->location);
  auVar3[1] = -(*(char *)((long)&other->location + 1) == *(char *)((long)&this->location + 1));
  auVar3[2] = -(*(char *)((long)&other->location + 2) == *(char *)((long)&this->location + 2));
  auVar3[3] = -(*(char *)((long)&other->location + 3) == *(char *)((long)&this->location + 3));
  auVar3[4] = -((char)other->binding == (char)this->binding);
  auVar3[5] = -(*(char *)((long)&other->binding + 1) == *(char *)((long)&this->binding + 1));
  auVar3[6] = -(*(char *)((long)&other->binding + 2) == *(char *)((long)&this->binding + 2));
  auVar3[7] = -(*(char *)((long)&other->binding + 3) == *(char *)((long)&this->binding + 3));
  auVar3[8] = -((char)other->offset == (char)this->offset);
  auVar3[9] = -(*(char *)((long)&other->offset + 1) == *(char *)((long)&this->offset + 1));
  auVar3[10] = -(*(char *)((long)&other->offset + 2) == *(char *)((long)&this->offset + 2));
  auVar3[0xb] = -(*(char *)((long)&other->offset + 3) == *(char *)((long)&this->offset + 3));
  auVar3[0xc] = -((char)other->format == (char)this->format);
  auVar3[0xd] = -(*(byte *)((long)&other->format + 1) == *(byte *)((long)&this->format + 1));
  auVar3[0xe] = -(*(byte *)((long)&other->format + 2) == *(byte *)((long)&this->format + 2));
  auVar3[0xf] = -(*(byte *)((long)&other->format + 3) == *(byte *)((long)&this->format + 3));
  MVar1 = this->matrixOrder;
  MVar2 = other->matrixOrder;
  auVar4[0] = -((char)MVar2 == (char)MVar1);
  auVar4[1] = -((char)(MVar2 >> 8) == (char)(MVar1 >> 8));
  auVar4[2] = -((char)(MVar2 >> 0x10) == (char)(MVar1 >> 0x10));
  auVar4[3] = -((char)(MVar2 >> 0x18) == (char)(MVar1 >> 0x18));
  auVar4[4] = 0xff;
  auVar4[5] = 0xff;
  auVar4[6] = 0xff;
  auVar4[7] = 0xff;
  auVar4[8] = 0xff;
  auVar4[9] = 0xff;
  auVar4[10] = 0xff;
  auVar4[0xb] = 0xff;
  auVar4[0xc] = 0xff;
  auVar4[0xd] = 0xff;
  auVar4[0xe] = 0xff;
  auVar4[0xf] = 0xff;
  auVar4 = auVar4 & auVar3;
  return (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                 (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) == 0xffff;
}

Assistant:

bool Layout::operator== (const Layout& other) const
{
	return	location == other.location &&
			binding == other.binding &&
			offset == other.offset &&
			format == other.format &&
			matrixOrder == other.matrixOrder;
}